

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O0

void __thiscall undo::UndoHistory::add(UndoHistory *this,UndoCommand *cmd)

{
  UndoState *this_00;
  UndoState *state;
  UndoCommand *cmd_local;
  UndoHistory *this_local;
  
  this_00 = (UndoState *)operator_new(0x20);
  UndoState::UndoState(this_00,cmd);
  this_00->m_prev = this->m_last;
  this_00->m_next = (UndoState *)0x0;
  this_00->m_parent = this->m_cur;
  if (this->m_first == (UndoState *)0x0) {
    this->m_first = this_00;
  }
  this->m_last = this_00;
  this->m_cur = this_00;
  if (this_00->m_prev != (UndoState *)0x0) {
    if (this_00->m_prev->m_next != (UndoState *)0x0) {
      __assert_fail("!state->m_prev->m_next",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp"
                    ,0x9b,"void undo::UndoHistory::add(UndoCommand *)");
    }
    this_00->m_prev->m_next = this_00;
  }
  return;
}

Assistant:

void UndoHistory::add(UndoCommand* cmd)
{
  UndoState* state = new UndoState(cmd);
  state->m_prev = m_last;
  state->m_next = nullptr;
  state->m_parent = m_cur;

  if (!m_first)
    m_first = state;

  m_cur = m_last = state;

  if (state->m_prev) {
    assert(!state->m_prev->m_next);
    state->m_prev->m_next = state;
  }
}